

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ArrayJoinPromiseNode<unsigned_int>::destroy(ArrayJoinPromiseNode<unsigned_int> *this)

{
  ExceptionOr<unsigned_int> *pEVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pEVar1 = (this->resultParts).ptr;
  if (pEVar1 != (ExceptionOr<unsigned_int> *)0x0) {
    sVar2 = (this->resultParts).size_;
    (this->resultParts).ptr = (ExceptionOr<unsigned_int> *)0x0;
    (this->resultParts).size_ = 0;
    pAVar3 = (this->resultParts).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar1,0x1a0,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<unsigned_int>_>::destruct);
  }
  ArrayJoinPromiseNodeBase::~ArrayJoinPromiseNodeBase(&this->super_ArrayJoinPromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }